

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * make_D3D_destarg_string(Context *ctx,char *buf,size_t buflen)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  size_t in_R8;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lStack_80;
  char writemask_str [6];
  char pred [32];
  char regnum_str [16];
  
  uVar3 = (ctx->dest_arg).result_shift - 1;
  pcVar8 = "";
  if (uVar3 < 0xf) {
    pcVar8 = &DAT_0012d510 + *(int *)(&DAT_0012d510 + (ulong)uVar3 * 4);
  }
  uVar3 = (ctx->dest_arg).result_mod;
  pcVar9 = "_sat";
  if ((uVar3 & 1) == 0) {
    pcVar9 = "";
  }
  pcVar7 = "_pp";
  if ((uVar3 & 2) == 0) {
    pcVar7 = "";
  }
  pcVar4 = "_centroid";
  if ((uVar3 & 4) == 0) {
    pcVar4 = "";
  }
  pcVar2 = get_D3D_register_string
                     (ctx,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum,regnum_str,in_R8);
  if (pcVar2 == (char *)0x0) {
    fail(ctx,"Unknown destination register type.");
    *buf = '\0';
  }
  else {
    iVar1 = isscalar(ctx,ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
    if ((iVar1 == 0) && ((ctx->dest_arg).writemask != 0xf)) {
      writemask_str[0] = '.';
      if ((ctx->dest_arg).writemask0 == 0) {
        lStack_80 = 1;
      }
      else {
        writemask_str[1] = 'x';
        lStack_80 = 2;
      }
      if ((ctx->dest_arg).writemask1 != 0) {
        writemask_str[lStack_80] = 'y';
        lStack_80 = lStack_80 + 1;
      }
      if ((ctx->dest_arg).writemask2 != 0) {
        writemask_str[lStack_80] = 'z';
        lStack_80 = lStack_80 + 1;
      }
      if ((ctx->dest_arg).writemask3 != 0) {
        writemask_str[lStack_80] = 'w';
        lStack_80 = lStack_80 + 1;
      }
    }
    else {
      lStack_80 = 0;
    }
    writemask_str[lStack_80] = '\0';
    pred[0x10] = '\0';
    pred[0x11] = '\0';
    pred[0x12] = '\0';
    pred[0x13] = '\0';
    pred[0x14] = '\0';
    pred[0x15] = '\0';
    pred[0x16] = '\0';
    pred[0x17] = '\0';
    pred[0x18] = '\0';
    pred[0x19] = '\0';
    pred[0x1a] = '\0';
    pred[0x1b] = '\0';
    pred[0x1c] = '\0';
    pred[0x1d] = '\0';
    pred[0x1e] = '\0';
    pred[0x1f] = '\0';
    pred[0] = '\0';
    pred[1] = '\0';
    pred[2] = '\0';
    pred[3] = '\0';
    pred[4] = '\0';
    pred[5] = '\0';
    pred[6] = '\0';
    pred[7] = '\0';
    pred[8] = '\0';
    pred[9] = '\0';
    pred[10] = '\0';
    pred[0xb] = '\0';
    pred[0xc] = '\0';
    pred[0xd] = '\0';
    pred[0xe] = '\0';
    pred[0xf] = '\0';
    if (ctx->predicated == 0) {
      pcVar5 = "";
      pcVar6 = "";
    }
    else {
      make_D3D_srcarg_string_in_buf(ctx,&ctx->predicate_arg,pred,0x20);
      pcVar6 = ") ";
      pcVar5 = "(";
    }
    snprintf(buf,0x40,"%s%s%s%s %s%s%s%s%s%s",pcVar8,pcVar9,pcVar7,pcVar4,pcVar5,pred,pcVar6,pcVar2,
             regnum_str,writemask_str);
  }
  return buf;
}

Assistant:

static const char *make_D3D_destarg_string(Context *ctx, char *buf,
                                           const size_t buflen)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    const char *result_shift_str = "";
    switch (arg->result_shift)
    {
        case 0x1: result_shift_str = "_x2"; break;
        case 0x2: result_shift_str = "_x4"; break;
        case 0x3: result_shift_str = "_x8"; break;
        case 0xD: result_shift_str = "_d8"; break;
        case 0xE: result_shift_str = "_d4"; break;
        case 0xF: result_shift_str = "_d2"; break;
    } // switch

    const char *sat_str = (arg->result_mod & MOD_SATURATE) ? "_sat" : "";
    const char *pp_str = (arg->result_mod & MOD_PP) ? "_pp" : "";
    const char *cent_str = (arg->result_mod & MOD_CENTROID) ? "_centroid" : "";

    char regnum_str[16];
    const char *regtype_str = get_D3D_register_string(ctx, arg->regtype,
                                                      arg->regnum, regnum_str,
                                                      sizeof (regnum_str));
    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown destination register type.");
        *buf = '\0';
        return buf;
    } // if

    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    const char *pred_left = "";
    const char *pred_right = "";
    char pred[32] = { '\0' };
    if (ctx->predicated)
    {
        pred_left = "(";
        pred_right = ") ";
        make_D3D_srcarg_string_in_buf(ctx, &ctx->predicate_arg,
                                      pred, sizeof (pred));
    } // if

    // may turn out something like "_x2_sat_pp_centroid (!p0.x) r0.xyzw" ...
    snprintf(buf, buflen, "%s%s%s%s %s%s%s%s%s%s",
             result_shift_str, sat_str, pp_str, cent_str,
             pred_left, pred, pred_right,
             regtype_str, regnum_str, writemask_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}